

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AsmJs.cpp
# Opt level: O2

void Js::AsmJSCompiler::VOutputMessage
               (ScriptContext *scriptContext,DEBUG_EVENT_INFO_TYPE messageType,wchar *message,
               __va_list_tag *argptr)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  WCHAR local_1028 [4];
  char16 buf [2048];
  
  iVar2 = _vsnwprintf_unsafe(local_1028,0x800,0xffffffffffffffff,message,argptr);
  iVar3 = 0x7ff;
  if (iVar2 != -1) {
    iVar3 = iVar2;
  }
  if (scriptContext->raiseMessageToDebuggerFunctionType != (RaiseMessageToDebuggerFunctionType)0x0)
  {
    (*scriptContext->raiseMessageToDebuggerFunctionType)
              (scriptContext,messageType,local_1028,scriptContext->url);
  }
  bVar1 = Phases::IsEnabled((Phases *)&DAT_01453738,AsmjsPhase);
  if ((!bVar1) && (bVar1 = Phases::IsEnabled((Phases *)&DAT_014594b0,AsmjsPhase), !bVar1)) {
    return;
  }
  Output::PrintBuffer(local_1028,(long)iVar3);
  Output::Print(L"\n");
  Output::Flush();
  return;
}

Assistant:

void AsmJSCompiler::VOutputMessage(ScriptContext * scriptContext, const DEBUG_EVENT_INFO_TYPE messageType, const wchar * message, va_list argptr)
    {
        char16 buf[2048];
        size_t size;

        size = _vsnwprintf_s(buf, _countof(buf), _TRUNCATE, message, argptr);
        if (size == -1)
        {
            size = _countof(buf) - 1;  // characters written, excluding the terminating null
        }
#ifdef ENABLE_SCRIPT_DEBUGGING
        scriptContext->RaiseMessageToDebugger(messageType, buf, scriptContext->GetUrl());
#endif
        if (PHASE_TRACE1(AsmjsPhase) || PHASE_TESTTRACE1(AsmjsPhase))
        {
            Output::PrintBuffer(buf, size);
            Output::Print(_u("\n"));
            Output::Flush();
        }
    }